

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O3

void __thiscall
JsonParser_deserialize_array_nested_Test::~JsonParser_deserialize_array_nested_Test
          (JsonParser_deserialize_array_nested_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(JsonParser, deserialize_array_nested) {
	json_parser parser;

	constexpr std::u8string_view json_data = u8R"json([
		true,
		false,
		1234
	,	[
				1,2,3,
				null,
				"text",
				[5,6,7]
		]		, [ ] , [	" text " ],
		12.34,
		0.1234,
		"text"
	])json"sv;

	auto array = parser.deserialize(json_data).get<std::vector<object>>();
	ASSERT_EQ(array.size(), 9U);
	EXPECT_EQ(array[0], true);
	EXPECT_EQ(array[1], false);
	EXPECT_EQ(array[2], 1234);
	EXPECT_FALSE(array[3].null());
	EXPECT_EQ(array[3].size(), 6U);
	EXPECT_FALSE(array[4].null());
	EXPECT_EQ(array[4].size(), 0U);
	EXPECT_FALSE(array[5].null());
	ASSERT_EQ(array[5].size(), 1U);
	EXPECT_EQ(array[5], std::vector<object>{ u8" text " });
	EXPECT_EQ(array[5], std::vector<std::u8string>{ u8" text " });
	EXPECT_DOUBLE_EQ(array[6].get<double>(), 12.34);
	EXPECT_DOUBLE_EQ(array[7].get<double>(), 0.1234);
	EXPECT_EQ(array[8], u8"text");

	auto nested_array = array[3].get<std::vector<object>>();
	ASSERT_EQ(nested_array.size(), 6U);
	EXPECT_EQ(nested_array[0], 1);
	EXPECT_EQ(nested_array[1], 2);
	EXPECT_EQ(nested_array[2], 3);
	EXPECT_TRUE(nested_array[3].null());
	EXPECT_EQ(nested_array[4],u8"text");
	std::vector<int> expected{ 5, 6, 7 };
	EXPECT_EQ(nested_array[5], expected);
}